

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  float fVar1;
  ImGuiID IVar2;
  ImVec2 IVar3;
  ImDrawList *draw_list;
  char *pcVar4;
  bool bVar5;
  byte bVar6;
  ImGuiPopupData *pIVar7;
  uint *puVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  ImRect IVar14;
  ImGuiWindow *local_160;
  bool local_155;
  ImVec2 local_fc;
  float local_f4;
  float fStack_f0;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 local_b0;
  ImU32 local_a8;
  ImU32 text_col;
  ImVec2 local_9c;
  float local_94;
  float local_90;
  float extra_w;
  float min_w;
  ImVec2 local_84;
  float local_7c;
  float w;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiWindowFlags flags;
  bool menu_is_open;
  ImGuiStyle *pIStack_38;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_18;
  bool enabled_local;
  char *label_local;
  
  window._7_1_ = enabled;
  pcStack_18 = label;
  g = (ImGuiContext *)GetCurrentWindow();
  if (((uint)(g->IO).DisplayFramebufferScale.y & 1) == 0) {
    style = (ImGuiStyle *)GImGui;
    pIStack_38 = &GImGui->Style;
    flags = ImGuiWindow::GetID((ImGuiWindow *)g,pcStack_18,(char *)0x0);
    label_size.y._3_1_ = IsPopupOpen(flags,0);
    label_size.x = 2.682225e-29;
    if (((g->IO).BackendFlags & 0x14000000U) != 0) {
      label_size.x = 1.07289e-28;
    }
    bVar5 = ImVector<unsigned_int>::contains
                      ((ImVector<unsigned_int> *)(style[0xb].Colors + 0x14),(uint *)&flags);
    if (bVar5) {
      if (label_size.y._3_1_) {
        label_size.y._3_1_ = BeginPopupEx(flags,(ImGuiWindowFlags)label_size.x);
      }
      else {
        ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)&style[6].Colors[0x2a].y);
      }
      label_local._7_1_ = label_size.y._3_1_;
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)(style[0xb].Colors + 0x14),(uint *)&flags);
      IVar13 = CalcTextSize(pcStack_18,(char *)0x0,true,-1.0);
      bVar5 = false;
      if ((((g->IO).BackendFlags & 0x4000000U) == 0) &&
         (bVar5 = false, (int)style[7].ItemSpacing.y < (int)style[7].FramePadding.y)) {
        pIVar7 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)&style[7].FramePadding.y,
                            (int)style[7].ItemSpacing.y);
        IVar2 = pIVar7->OpenParentId;
        puVar8 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)&(g->IO).GetClipboardTextFn)
        ;
        bVar5 = IVar2 == *puVar8;
      }
      IVar3 = style[7].ButtonTextAlign;
      if (bVar5) {
        style[7].ButtonTextAlign = (ImVec2)g;
      }
      ImVec2::ImVec2(&pos);
      local_68 = (ImVec2)(g->IO).ClipboardUserData;
      backed_nav_window._4_4_ = IVar13.x;
      if (*(int *)((g->IO).KeysDown + 0xb4) == 0) {
        fVar10 = local_68.x - 1.0;
        fVar1 = (pIStack_38->ItemSpacing).x;
        fVar11 = local_68.y - (pIStack_38->FramePadding).y;
        fVar12 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)g);
        ImVec2::ImVec2(&local_70,fVar10 - (float)(int)(fVar1 * 0.5),fVar11 + fVar12);
        pos = local_70;
        *(float *)&(g->IO).ClipboardUserData =
             (float)(int)((pIStack_38->ItemSpacing).x * 0.5) + *(float *)&(g->IO).ClipboardUserData;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,(pIStack_38->ItemSpacing).x * 2.0,
                       (pIStack_38->ItemSpacing).y);
        PushStyleVar(0xd,(ImVec2 *)&stack0xffffffffffffff88);
        pcVar4 = pcStack_18;
        local_7c = backed_nav_window._4_4_;
        uVar9 = 0;
        if (((window._7_1_ ^ 0xff) & 1) != 0) {
          uVar9 = 8;
        }
        ImVec2::ImVec2(&local_84,backed_nav_window._4_4_,0.0);
        backed_nav_window._3_1_ = Selectable(pcVar4,label_size.y._3_1_,uVar9 | 0x300001,&local_84);
        PopStyleVar(1);
        *(float *)&(g->IO).ClipboardUserData =
             (float)(int)((pIStack_38->ItemSpacing).x * -0.5) + *(float *)&(g->IO).ClipboardUserData
        ;
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&extra_w,local_68.x,local_68.y - (pIStack_38->WindowPadding).y);
        pos = _extra_w;
        local_90 = ImGuiMenuColumns::DeclColumns
                             ((ImGuiMenuColumns *)((g->IO).KeysDown + 0x60),backed_nav_window._4_4_,
                              0.0,(float)(int)(style[6].Colors[8].w * 1.2));
        local_9c = GetContentRegionAvail();
        local_94 = ImMax<float>(0.0,local_9c.x - local_90);
        pcVar4 = pcStack_18;
        bVar6 = ~window._7_1_;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,local_90,0.0);
        backed_nav_window._3_1_ =
             Selectable(pcVar4,label_size.y._3_1_,(bVar6 & 1) * 8 + 0xb00001,
                        (ImVec2 *)&stack0xffffffffffffff5c);
        local_a8 = GetColorU32((byte)~window._7_1_ & 1,1.0);
        draw_list = *(ImDrawList **)((g->IO).KeysDown + 0x1b8);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,
                       style[6].Colors[8].w * 0.3 + *(float *)((g->IO).KeysDown + 0x74) + local_94,
                       0.0);
        local_b0 = ::operator+(&local_68,(ImVec2 *)&stack0xffffffffffffff48);
        RenderArrow(draw_list,local_b0,local_a8,1,1.0);
      }
      local_155 = false;
      if ((window._7_1_ & 1) != 0) {
        local_155 = ItemHoverable((ImRect *)((g->IO).KeysDown + 0x24),flags);
      }
      if (bVar5) {
        style[7].ButtonTextAlign = IVar3;
      }
      child_menu_window._6_1_ = 0;
      child_menu_window._5_1_ = false;
      if (*(int *)((g->IO).KeysDown + 0xb4) == 1) {
        child_menu_window._4_1_ = false;
        if (((int)style[7].ItemSpacing.y < (int)style[7].FramePadding.y) &&
           (pIVar7 = ImVector<ImGuiPopupData>::operator[]
                               ((ImVector<ImGuiPopupData> *)&style[7].FramePadding.y,
                                (int)style[7].ItemSpacing.y),
           (ImGuiContext *)pIVar7->SourceWindow == g)) {
          pIVar7 = ImVector<ImGuiPopupData>::operator[]
                             ((ImVector<ImGuiPopupData> *)&style[7].FramePadding.y,
                              (int)style[7].ItemSpacing.y);
          local_160 = pIVar7->Window;
        }
        else {
          local_160 = (ImGuiWindow *)0x0;
        }
        if (((*(ImGuiContext **)&style[6].Colors[0x1f].w == g) && (local_160 != (ImGuiWindow *)0x0))
           && (((g->IO).BackendFlags & 0x400U) == 0)) {
          IVar14 = ImGuiWindow::Rect(local_160);
          ta = IVar14.Min;
          tb = ::operator-((ImVec2 *)&style->Colors[5].w,(ImVec2 *)(style->Colors + 0x2f));
          if ((local_160->Pos).x <= (float)(g->IO).KeyMap[3]) {
            tc = ImRect::GetTR((ImRect *)&ta);
          }
          else {
            tc = ImRect::GetTL((ImRect *)&ta);
          }
          if ((local_160->Pos).x <= (float)(g->IO).KeyMap[3]) {
            _fStack_f0 = ImRect::GetBR((ImRect *)&ta);
          }
          else {
            _fStack_f0 = ImRect::GetBL((ImRect *)&ta);
          }
          local_f4 = ImClamp<float>(ABS(tb.x - tc.x) * 0.3,5.0,30.0);
          uVar9 = -(uint)((float)(g->IO).KeyMap[3] < (local_160->Pos).x);
          fVar1 = tb.y;
          tb.x = (float)(~uVar9 & 0x3f000000 | uVar9 & 0xbf000000) + tb.x;
          fVar10 = ImMax<float>((tc.y - local_f4) - tb.y,-100.0);
          tc.y = fVar1 + fVar10;
          fVar1 = tb.y;
          fVar10 = ImMin<float>((extra + local_f4) - tb.y,100.0);
          extra = fVar1 + fVar10;
          child_menu_window._4_1_ =
               ImTriangleContainsPoint
                         (&tb,&tc,(ImVec2 *)&stack0xffffffffffffff10,(ImVec2 *)&style->Colors[5].w);
        }
        if ((((label_size.y._3_1_) && (local_155 == false)) &&
            ((*(ImGuiContext **)&style[6].Colors[0x1f].w == g &&
             ((style[6].Colors[0x23].w != 0.0 && (style[6].Colors[0x23].w != (float)flags)))))) &&
           (child_menu_window._4_1_ == false)) {
          child_menu_window._5_1_ = true;
        }
        if (((label_size.y._3_1_) || (local_155 == false)) || (backed_nav_window._3_1_ == false)) {
          if (((!label_size.y._3_1_) && (local_155 != false)) && (child_menu_window._4_1_ == false))
          {
            child_menu_window._6_1_ = 1;
          }
        }
        else {
          child_menu_window._6_1_ = 1;
        }
        if (style[7].DisplayWindowPadding.x == (float)flags) {
          child_menu_window._6_1_ = (label_size.y._3_1_ ^ 0xffU) & 1;
          child_menu_window._5_1_ = label_size.y._3_1_;
        }
        if (((style[7].SelectableTextAlign.x == (float)flags) &&
            (((uint)style[7].Colors[4].x & 1) != 0)) && (style[7].Colors[5].x == 1.4013e-45)) {
          child_menu_window._6_1_ = 1;
          NavMoveRequestCancel();
        }
      }
      else if (((label_size.y._3_1_) && (backed_nav_window._3_1_ != false)) && (bVar5)) {
        child_menu_window._5_1_ = true;
        label_size.y._3_1_ = false;
        child_menu_window._6_1_ = 0;
      }
      else if ((backed_nav_window._3_1_ != false) ||
              (((local_155 != false && (bVar5)) && (!label_size.y._3_1_)))) {
        child_menu_window._6_1_ = 1;
      }
      else if (((style[7].SelectableTextAlign.x == (float)flags) &&
               (((uint)style[7].Colors[4].x & 1) != 0)) && (style[7].Colors[5].x == 4.2039e-45)) {
        child_menu_window._6_1_ = 1;
        NavMoveRequestCancel();
      }
      if ((window._7_1_ & 1) == 0) {
        child_menu_window._5_1_ = true;
      }
      if ((child_menu_window._5_1_ != false) && (bVar5 = IsPopupOpen(flags,0), bVar5)) {
        ClosePopupToLevel((int)style[7].ItemSpacing.y,true);
      }
      if (((label_size.y._3_1_ == false) && (child_menu_window._6_1_ != 0)) &&
         ((int)style[7].ItemSpacing.y < (int)style[7].FramePadding.y)) {
        OpenPopup(pcStack_18,0);
        label_local._7_1_ = false;
      }
      else {
        bVar5 = label_size.y._3_1_ != false;
        label_size.y._3_1_ = bVar5 || child_menu_window._6_1_ != 0;
        if (child_menu_window._6_1_ != 0) {
          OpenPopup(pcStack_18,0);
        }
        if (bVar5 || child_menu_window._6_1_ != 0) {
          ImVec2::ImVec2(&local_fc,0.0,0.0);
          SetNextWindowPos(&pos,1,&local_fc);
          label_size.y._3_1_ = BeginPopupEx(flags,(ImGuiWindowFlags)label_size.x);
        }
        else {
          ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)&style[6].Colors[0x2a].y);
        }
        label_local._7_1_ = label_size.y._3_1_;
      }
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, 0.0f, IM_FLOOR(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(min_w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}